

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O2

int Cut_CellTableLookup(Cut_CMan_t *p,Cut_Cell_t *pCell)

{
  uint uVar1;
  int iVar2;
  Cut_Cell_t **in_RAX;
  Cut_Cell_t *pCVar3;
  Cut_Cell_t **pSlot;
  
  uVar1 = *(uint *)&pCell->field_0x20 & 0xf;
  iVar2 = 1 << ((char)uVar1 - 5U & 0x1f);
  if (uVar1 < 6) {
    iVar2 = 1;
  }
  pSlot = in_RAX;
  uVar1 = Extra_TruthHash(pCell->uTruth,iVar2);
  iVar2 = st__find_or_add(p->tTable,(char *)(ulong)uVar1,(char ***)&pSlot);
  pCVar3 = (Cut_Cell_t *)pSlot;
  if (iVar2 == 0) {
    *pSlot = (Cut_Cell_t *)0x0;
  }
  do {
    pCVar3 = pCVar3->pNext;
    if (pCVar3 == (Cut_Cell_t *)0x0) {
      pCell->pNext = *pSlot;
      *pSlot = pCell;
      uVar1 = *(uint *)&pCell->field_0x20 & 0xf;
      pCell->pNextVar = p->pSameVar[uVar1];
      p->pSameVar[uVar1] = pCell;
      return 0;
    }
    uVar1 = *(uint *)&pCVar3->field_0x20 & 0xf;
  } while ((uVar1 != (*(uint *)&pCell->field_0x20 & 0xf)) ||
          (iVar2 = Extra_TruthIsEqual(pCVar3->uTruth,pCell->uTruth,uVar1), iVar2 == 0));
  return 1;
}

Assistant:

int Cut_CellTableLookup( Cut_CMan_t * p, Cut_Cell_t * pCell )
{
    Cut_Cell_t ** pSlot, * pTemp;
    unsigned Hash;
    Hash = Extra_TruthHash( pCell->uTruth, Extra_TruthWordNum( pCell->nVars ) );
    if ( ! st__find_or_add( p->tTable, (char *)(ABC_PTRUINT_T)Hash, (char ***)&pSlot ) )
        *pSlot = NULL;
    for ( pTemp = *pSlot; pTemp; pTemp = pTemp->pNext )
    {
        if ( pTemp->nVars != pCell->nVars )
            continue;
        if ( Extra_TruthIsEqual(pTemp->uTruth, pCell->uTruth, pCell->nVars) )
            return 1;
    }
    // the entry is new
    pCell->pNext = *pSlot;
    *pSlot = pCell;
    // add it to the variable support list
    pCell->pNextVar = p->pSameVar[pCell->nVars];
    p->pSameVar[pCell->nVars] = pCell;
    return 0;
}